

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * lj_debug_slotname(GCproto *pt,BCIns *ip,BCReg slot,char **name)

{
  GCproto *pGVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  BCIns *pBVar9;
  char *local_40;
  
  pGVar1 = pt + 1;
  pcVar4 = debug_varname(pt,(BCPos)((ulong)((long)ip - (long)pGVar1) >> 2),slot);
  do {
    if (pcVar4 != (char *)0x0) {
      *name = pcVar4;
      return "local";
    }
    do {
      pBVar9 = ip + -1;
      if (pBVar9 < pGVar1 || (long)pBVar9 - (long)pGVar1 == 0) {
        return (char *)0x0;
      }
      uVar5 = *pBVar9;
      uVar6 = uVar5 >> 8 & 0xff;
      if ((lj_bc_mode[uVar5 & 0xff] & 7) == 1) {
        if (uVar6 != slot) goto LAB_0010cc9b;
        uVar8 = uVar5 & 0xff;
        iVar3 = 1;
        if (uVar8 < 0x36) {
          if (uVar8 == 0x12) {
            slot = uVar5 >> 0x10;
            iVar3 = 2;
          }
          else if (uVar8 == 0x2d) {
            pcVar4 = (char *)(ulong)(pt->uvinfo).ptr32;
            pcVar7 = "";
            if ((pcVar4 != (char *)0x0) && (pcVar7 = pcVar4, 0xffff < uVar5)) {
              uVar5 = uVar5 >> 0x10;
              do {
                do {
                  cVar2 = *pcVar4;
                  pcVar4 = pcVar4 + 1;
                } while (cVar2 != '\0');
                uVar5 = uVar5 - 1;
                pcVar7 = pcVar4;
              } while (uVar5 != 0);
            }
            *name = pcVar7;
            local_40 = "upvalue";
          }
          else {
LAB_0010cc27:
            iVar3 = 1;
            local_40 = (char *)0x0;
          }
        }
        else if (uVar8 == 0x36) {
          *name = (char *)((ulong)*(uint *)((ulong)(pt->k).ptr32 + (long)(int)~(uVar5 >> 0x10) * 4)
                          + 0x10);
          local_40 = "global";
        }
        else {
          if (uVar8 != 0x39) goto LAB_0010cc27;
          *name = (char *)((ulong)*(uint *)((ulong)(pt->k).ptr32 +
                                           (long)(int)(~uVar5 >> 0x10 | 0xffffff00) * 4) + 0x10);
          uVar8 = ip[-2];
          if ((((char)uVar8 == '\x12') && ((uVar8 >> 8 & 0xff) == uVar6 + 1)) &&
             (uVar8 >> 0x10 == uVar5 >> 0x18)) {
            local_40 = "method";
          }
          else {
            local_40 = "field";
          }
        }
      }
      else {
        if ((((lj_bc_mode[uVar5 & 0xff] & 7) == 2) && (uVar6 <= slot)) &&
           ((uVar5 & 0xff) != 0x2c || slot <= uVar5 >> 0x10)) goto LAB_0010cc27;
LAB_0010cc9b:
        iVar3 = 0;
      }
      ip = pBVar9;
    } while (iVar3 == 0);
    if (iVar3 != 2) {
      return local_40;
    }
    pcVar4 = debug_varname(pt,(BCPos)((ulong)((long)pBVar9 - (long)pGVar1) >> 2),slot);
  } while( true );
}

Assistant:

const char *lj_debug_slotname(GCproto *pt, const BCIns *ip, BCReg slot,
			      const char **name)
{
  const char *lname;
restart:
  lname = debug_varname(pt, proto_bcpos(pt, ip), slot);
  if (lname != NULL) { *name = lname; return "local"; }
  while (--ip > proto_bc(pt)) {
    BCIns ins = *ip;
    BCOp op = bc_op(ins);
    BCReg ra = bc_a(ins);
    if (bcmode_a(op) == BCMbase) {
      if (slot >= ra && (op != BC_KNIL || slot <= bc_d(ins)))
	return NULL;
    } else if (bcmode_a(op) == BCMdst && ra == slot) {
      switch (bc_op(ins)) {
      case BC_MOV:
	if (ra == slot) { slot = bc_d(ins); goto restart; }
	break;
      case BC_GGET:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_d(ins))));
	return "global";
      case BC_TGETS:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_c(ins))));
	if (ip > proto_bc(pt)) {
	  BCIns insp = ip[-1];
	  if (bc_op(insp) == BC_MOV && bc_a(insp) == ra+1+LJ_FR2 &&
	      bc_d(insp) == bc_b(ins))
	    return "method";
	}
	return "field";
      case BC_UGET:
	*name = lj_debug_uvname(pt, bc_d(ins));
	return "upvalue";
      default:
	return NULL;
      }
    }
  }
  return NULL;
}